

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

int secp256k1_gej_eq_x_var(secp256k1_fe *x,secp256k1_gej *a)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  secp256k1_fe r;
  secp256k1_fe sStack_48;
  
  secp256k1_fe_verify(x);
  if ((a->x).magnitude < 0x20) {
    secp256k1_gej_verify(a);
    if (a->infinity == 0) {
      secp256k1_fe_sqr(&sStack_48,&a->z);
      secp256k1_fe_mul(&sStack_48,&sStack_48,x);
      iVar1 = secp256k1_fe_equal_var(&sStack_48,&a->x);
      return iVar1;
    }
    pcVar3 = "test condition failed: !a->infinity";
    uVar2 = 0x147;
  }
  else {
    pcVar3 = "test condition failed: a->x.magnitude <= 31";
    uVar2 = 0x145;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/group_impl.h"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static int secp256k1_gej_eq_x_var(const secp256k1_fe *x, const secp256k1_gej *a) {
    secp256k1_fe r;

#ifdef VERIFY
    secp256k1_fe_verify(x);
    VERIFY_CHECK(a->x.magnitude <= 31);
    secp256k1_gej_verify(a);
    VERIFY_CHECK(!a->infinity);
#endif

    secp256k1_fe_sqr(&r, &a->z); secp256k1_fe_mul(&r, &r, x);
    return secp256k1_fe_equal_var(&r, &a->x);
}